

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpint.c
# Opt level: O3

void mp_lshift_safe_in_place(mp_int *r,size_t bits)

{
  ulong uVar1;
  BignumInt *pBVar2;
  uint uVar3;
  byte bVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  BignumInt BVar9;
  
  uVar1 = r->nw;
  if (uVar1 != 0) {
    uVar5 = (uint)bits & 0x3f;
    pBVar2 = r->w;
    uVar7 = 0;
    do {
      if ((long)(uVar1 - (bits >> 6)) < 0) {
        BVar9 = 0;
      }
      else {
        BVar9 = pBVar2[uVar7];
      }
      pBVar2[uVar7] = BVar9;
      uVar7 = uVar7 + 1;
    } while (uVar1 != uVar7);
    bVar4 = 0;
    do {
      lVar8 = -1L << (bVar4 & 0x3f);
      uVar7 = uVar1;
      do {
        if (lVar8 + -1 + uVar7 < uVar1) {
          BVar9 = pBVar2[lVar8 + (uVar7 - 1)];
        }
        else {
          BVar9 = 0;
        }
        if ((1L << (bVar4 & 0x3f) & bits >> 6) == 0) {
          BVar9 = pBVar2[uVar7 - 1];
        }
        pBVar2[uVar7 - 1] = BVar9;
        uVar7 = uVar7 - 1;
      } while (uVar7 != 0);
      bVar4 = bVar4 + 1;
    } while (uVar1 >> (bVar4 & 0x3f) != 0);
    if (uVar1 != 0) {
      uVar3 = 0x40 - uVar5;
      uVar6 = (ulong)(uVar3 >> 6) - 1;
      pBVar2 = r->w;
      uVar7 = uVar1 - 2;
      do {
        if (uVar7 < uVar1) {
          BVar9 = pBVar2[uVar7];
        }
        else {
          BVar9 = 0;
        }
        pBVar2[uVar7 + 1] =
             BVar9 >> ((byte)uVar3 & (byte)uVar6 & 0x3f) & uVar6 | pBVar2[uVar7 + 1] << (sbyte)uVar5
        ;
        uVar7 = uVar7 - 1;
      } while (uVar7 != 0xfffffffffffffffe);
    }
  }
  return;
}

Assistant:

static void mp_lshift_safe_in_place(mp_int *r, size_t bits)
{
    size_t wordshift = bits / BIGNUM_INT_BITS;
    size_t bitshift = bits % BIGNUM_INT_BITS;

    /*
     * Same strategy as mp_rshift_safe_in_place, but of course the
     * other way up.
     */

    unsigned clear = (r->nw - wordshift) >> (CHAR_BIT * sizeof(size_t) - 1);
    mp_cond_clear(r, clear);

    for (unsigned bit = 0; r->nw >> bit; bit++) {
        size_t word_offset = (size_t)1 << bit;
        BignumInt mask = -(BignumInt)((wordshift >> bit) & 1);
        for (size_t i = r->nw; i-- > 0 ;) {
            BignumInt w = mp_word(r, i - word_offset);
            r->w[i] ^= (r->w[i] ^ w) & mask;
        }
    }

    size_t downshift = BIGNUM_INT_BITS - bitshift;
    size_t no_shift = (downshift >> BIGNUM_INT_BITS_BITS);
    downshift &= ~-(size_t)no_shift;
    BignumInt downshifted_mask = ~-(BignumInt)no_shift;

    for (size_t i = r->nw; i-- > 0 ;) {
        r->w[i] = (r->w[i] << bitshift) |
            ((mp_word(r, i-1) >> downshift) & downshifted_mask);
    }
}